

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool GetEQ(ConfigScanner *sc)

{
  _Bool result;
  ConfigScanner *sc_local;
  _Bool local_1;
  
  if (sc == (ConfigScanner *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = *sc->ptr == '=';
    if (local_1) {
      sc->ptr = sc->ptr + 1;
    }
  }
  return local_1;
}

Assistant:

bool GetEQ(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	bool result = *sc->ptr == '=';
	if (result)
	{
		sc->ptr++;
	}
	return result;
}